

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_kvs_header_read(kvs_header *kv_header,docio_handle *dhandle,uint64_t kv_info_offset,
                        uint64_t version,bool only_seq_nums)

{
  undefined8 in_RDX;
  undefined8 *in_RSI;
  byte in_R8B;
  docio_object doc;
  int64_t offset;
  docio_object *in_stack_00000088;
  uint64_t in_stack_00000090;
  docio_handle *in_stack_00000098;
  bool in_stack_000000f7;
  uint64_t in_stack_000000f8;
  size_t in_stack_00000100;
  void *in_stack_00000108;
  kvs_header *in_stack_00000110;
  undefined8 in_stack_ffffffffffffff78;
  docio_object *in_stack_ffffffffffffff80;
  undefined1 local_68 [56];
  fdb_status local_30;
  byte local_21;
  undefined8 local_18;
  undefined8 *local_10;
  
  local_21 = in_R8B & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  docio_object::docio_object(in_stack_ffffffffffffff80);
  memset(local_68,0,0x38);
  _local_30 = (fdb_status)
              docio_read_doc(in_stack_00000098,in_stack_00000090,in_stack_00000088,kv_header._7_1_);
  if ((long)_local_30 < 1) {
    fdb_log_impl((err_log_callback *)local_10[6],2,(fdb_status)((ulong)_local_30 & 0xffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                 ,"fdb_kvs_header_read",0x4ae,
                 "Failed to read a KV header with the offset %lu from a database file \'%s\'",
                 local_18,*(undefined8 *)*local_10);
  }
  else {
    _fdb_kvs_header_import
              (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
               in_stack_000000f7);
    free_docio_object(in_stack_ffffffffffffff80,(uint8_t)((ulong)in_stack_ffffffffffffff78 >> 0x38),
                      (uint8_t)((ulong)in_stack_ffffffffffffff78 >> 0x30),
                      (uint8_t)((ulong)in_stack_ffffffffffffff78 >> 0x28));
  }
  return;
}

Assistant:

void fdb_kvs_header_read(struct kvs_header *kv_header,
                         struct docio_handle *dhandle,
                         uint64_t kv_info_offset,
                         uint64_t version,
                         bool only_seq_nums)
{
    int64_t offset;
    struct docio_object doc;

    memset(&doc, 0, sizeof(struct docio_object));
    offset = docio_read_doc(dhandle, kv_info_offset, &doc, true);

    if (offset <= 0) {
        fdb_log(dhandle->log_callback, FDB_LOG_ERROR, (fdb_status) offset,
                "Failed to read a KV header with the offset %" _F64 " from a "
                "database file '%s'", kv_info_offset, dhandle->file->filename);
        return;
    }

    _fdb_kvs_header_import(kv_header, doc.body, doc.length.bodylen,
                           version, only_seq_nums);
    free_docio_object(&doc, 1, 1, 1);
}